

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

TypeBase *
CreateGenericTypeInstance
          (ExpressionContext *ctx,SynBase *source,TypeGenericClassProto *proto,
          IntrusiveList<TypeHandle> *types)

{
  __jmp_buf_tag *__env;
  bool bVar1;
  ScopeData *pSVar2;
  SynBase *pSVar3;
  TypeHandle *pTVar4;
  uint uVar5;
  int iVar6;
  Node *pNVar7;
  ExprBase *node;
  size_t sVar8;
  char *dst;
  char *pcVar9;
  Node *pNVar10;
  char *pcVar11;
  ExprBase *pEVar12;
  TypeClass *pTVar13;
  InplaceStr IVar14;
  jmp_buf prevErrorHandler;
  undefined1 local_f8 [200];
  
  IVar14 = GetGenericClassTypeName(ctx,&proto->super_TypeBase,*types);
  uVar5 = NULLC::GetStringHash(IVar14.begin,IVar14.end);
  pNVar10 = (ctx->genericTypeMap).entries[uVar5 & 0x3ff];
  if (pNVar10 == (Node *)0x0) {
    pNVar7 = (Node *)0x0;
  }
  else {
    do {
      pNVar7 = pNVar10;
      if (pNVar10->hash == uVar5) break;
      pNVar10 = pNVar10->next;
      pNVar7 = (Node *)0x0;
    } while (pNVar10 != (Node *)0x0);
  }
  if (pNVar7 == (Node *)0x0) {
    pSVar2 = ctx->scope;
    pSVar3 = proto->source;
    ctx->scope = proto->scope;
    ctx->lookupLocation = pSVar3;
    __env = ctx->errorHandler;
    memcpy(local_f8,__env,200);
    bVar1 = ctx->errorHandlerNested;
    ctx->errorHandlerNested = true;
    uVar5 = ctx->classInstanceDepth + 1;
    ctx->classInstanceDepth = uVar5;
    if (0x40 < uVar5) {
      anon_unknown.dwarf_9fd58::Stop
                (ctx,source,"ERROR: reached maximum generic type instance depth (%d)",0x40);
    }
    uVar5 = *(uint *)(NULLC::traceContext + 0x244);
    iVar6 = _setjmp((__jmp_buf_tag *)__env);
    if (iVar6 != 0) {
      NULLC::TraceLeaveTo(uVar5);
      ctx->classInstanceDepth = ctx->classInstanceDepth - 1;
      ctx->scope = pSVar2;
      ctx->lookupLocation = (SynBase *)0x0;
      pcVar11 = ctx->errorBuf;
      if (pcVar11 != (char *)0x0) {
        sVar8 = strlen(pcVar11);
        pcVar11 = pcVar11 + sVar8;
        iVar6 = NULLC::SafeSprintf(pcVar11,(ulong)(ctx->errorBufSize - (int)sVar8),
                                   "while instantiating generic type %.*s<",
                                   (ulong)(uint)(*(int *)&(proto->super_TypeBase).name.end -
                                                (int)(proto->super_TypeBase).name.begin));
        dst = pcVar11 + iVar6;
        for (pTVar4 = types->head; pTVar4 != (TypeHandle *)0x0; pTVar4 = pTVar4->next) {
          pcVar9 = ", ";
          if (pTVar4 == types->head) {
            pcVar9 = "";
          }
          iVar6 = NULLC::SafeSprintf(dst,(ulong)((*(int *)&ctx->errorBuf - (int)dst) +
                                                ctx->errorBufSize),"%s%.*s",pcVar9,
                                     (ulong)(uint)(*(int *)&(pTVar4->type->name).end -
                                                  (int)(pTVar4->type->name).begin));
          dst = dst + iVar6;
        }
        iVar6 = NULLC::SafeSprintf(dst,(ulong)((*(int *)&ctx->errorBuf - (int)dst) +
                                              ctx->errorBufSize),">");
        anon_unknown.dwarf_9fd58::AddRelatedErrorInfoWithLocation(ctx,source,pcVar11,dst + iVar6);
      }
      memcpy(__env,local_f8,200);
      ctx->errorHandlerNested = bVar1;
      longjmp((__jmp_buf_tag *)__env,1);
    }
    node = AnalyzeClassDefinition(ctx,proto->definition,proto,*types);
    ctx->classInstanceDepth = ctx->classInstanceDepth - 1;
    ctx->scope = pSVar2;
    ctx->lookupLocation = (SynBase *)0x0;
    memcpy(__env,local_f8,200);
    ctx->errorHandlerNested = bVar1;
    if ((node == (ExprBase *)0x0) || (pEVar12 = node, node->typeID != 0x2d)) {
      pEVar12 = (ExprBase *)0x0;
    }
    if (pEVar12 == (ExprBase *)0x0) {
      anon_unknown.dwarf_9fd58::Stop
                (ctx,source,"ERROR: type \'%.*s\' couldn\'t be instantiated",
                 (ulong)(uint)(*(int *)&(proto->super_TypeBase).name.end -
                              (int)(proto->super_TypeBase).name.begin));
    }
    IntrusiveList<ExprBase>::push_back(&proto->instances,node);
    pTVar13 = (TypeClass *)pEVar12[1]._vptr_ExprBase;
  }
  else {
    pTVar13 = pNVar7->value;
  }
  return (TypeBase *)pTVar13;
}

Assistant:

TypeBase* CreateGenericTypeInstance(ExpressionContext &ctx, SynBase *source, TypeGenericClassProto *proto, IntrusiveList<TypeHandle> &types)
{
	InplaceStr className = GetGenericClassTypeName(ctx, proto, types);

	// Check if type already exists
	if(TypeClass **prev = ctx.genericTypeMap.find(className.hash()))
		return *prev;

	// Switch to original type scope
	ScopeData *scope = ctx.scope;

	ctx.SwitchToScopeAtPoint(proto->scope, proto->source);

	ExprBase *result = NULL;

	jmp_buf prevErrorHandler;
	memcpy(&prevErrorHandler, &ctx.errorHandler, sizeof(jmp_buf));

	bool prevErrorHandlerNested = ctx.errorHandlerNested;
	ctx.errorHandlerNested = true;

	ctx.classInstanceDepth++;

	if(ctx.classInstanceDepth > NULLC_MAX_GENERIC_INSTANCE_DEPTH)
		Stop(ctx, source, "ERROR: reached maximum generic type instance depth (%d)", NULLC_MAX_GENERIC_INSTANCE_DEPTH);

	unsigned traceDepth = NULLC::TraceGetDepth();

	if(!setjmp(ctx.errorHandler))
	{
		result = AnalyzeClassDefinition(ctx, proto->definition, proto, types);
	}
	else
	{
		NULLC::TraceLeaveTo(traceDepth);

		ctx.classInstanceDepth--;

		// Restore old scope
		ctx.SwitchToScopeAtPoint(scope, NULL);

		// Additional error info
		if(ctx.errorBuf)
		{
			char *errorCurr = ctx.errorBuf + strlen(ctx.errorBuf);

			const char *messageStart = errorCurr;

			errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "while instantiating generic type %.*s<", FMT_ISTR(proto->name));

			for(TypeHandle *curr = types.head; curr; curr = curr->next)
			{
				TypeBase *type = curr->type;

				errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "%s%.*s", curr != types.head ? ", " : "", FMT_ISTR(type->name));
			}

			errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), ">");

			const char *messageEnd = errorCurr;

			AddRelatedErrorInfoWithLocation(ctx, source, messageStart, messageEnd);
		}

		memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
		ctx.errorHandlerNested = prevErrorHandlerNested;

		longjmp(ctx.errorHandler, 1);
	}

	ctx.classInstanceDepth--;

	// Restore old scope
	ctx.SwitchToScopeAtPoint(scope, NULL);

	memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
	ctx.errorHandlerNested = prevErrorHandlerNested;

	if(ExprClassDefinition *definition = getType<ExprClassDefinition>(result))
	{
		proto->instances.push_back(result);

		return definition->classType;
	}

	Stop(ctx, source, "ERROR: type '%.*s' couldn't be instantiated", FMT_ISTR(proto->name));

	return NULL;
}